

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O1

void __thiscall
Diligent::GLContextState::SetStencilOp
          (GLContextState *this,GLenum Face,STENCIL_OP StencilFailOp,STENCIL_OP StencilDepthFailOp,
          STENCIL_OP StencilPassOp)

{
  GLenum GVar1;
  GLenum GVar2;
  undefined7 in_register_00000009;
  bool bVar3;
  string msg;
  GLenum err;
  string local_58;
  uint local_34;
  
  bVar3 = Face != 0x404;
  if ((((this->m_DSState).m_StencilOpState[bVar3].StencilFailOp != StencilFailOp) ||
      ((this->m_DSState).m_StencilOpState[bVar3].StencilDepthFailOp != StencilDepthFailOp)) ||
     ((this->m_DSState).m_StencilOpState[bVar3].StencilPassOp != StencilPassOp)) {
    if ('\b' < (char)StencilFailOp) {
      FormatString<char[26],char[52]>
                (&local_58,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"StencilOp < int{_countof(StencilOp2GlStencilOpMap)}",
                 (char (*) [52])CONCAT71(in_register_00000009,StencilDepthFailOp));
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"StencilOp2GlStencilOp",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
                 ,0x165);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    GVar1 = *(GLenum *)
             (StencilOp2GlStencilOp(Diligent::STENCIL_OP)::StencilOp2GlStencilOpMap +
             (long)(char)StencilFailOp * 4);
    if ('\b' < (char)StencilDepthFailOp) {
      FormatString<char[26],char[52]>
                (&local_58,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"StencilOp < int{_countof(StencilOp2GlStencilOpMap)}",
                 (char (*) [52])
                 StencilOp2GlStencilOp(Diligent::STENCIL_OP)::StencilOp2GlStencilOpMap);
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"StencilOp2GlStencilOp",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
                 ,0x165);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    GVar2 = *(GLenum *)
             (StencilOp2GlStencilOp(Diligent::STENCIL_OP)::StencilOp2GlStencilOpMap +
             (long)(char)StencilDepthFailOp * 4);
    if ('\b' < (char)StencilPassOp) {
      FormatString<char[26],char[52]>
                (&local_58,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"StencilOp < int{_countof(StencilOp2GlStencilOpMap)}",
                 (char (*) [52])
                 StencilOp2GlStencilOp(Diligent::STENCIL_OP)::StencilOp2GlStencilOpMap);
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"StencilOp2GlStencilOp",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
                 ,0x165);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    (*__glewStencilOpSeparate)
              (Face,GVar1,GVar2,
               *(GLenum *)
                (StencilOp2GlStencilOp(Diligent::STENCIL_OP)::StencilOp2GlStencilOpMap +
                (long)(char)StencilPassOp * 4));
    local_34 = glGetError();
    if (local_34 != 0) {
      LogError<false,char[32],char[17],unsigned_int>
                (false,"SetStencilOp",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x239,(char (*) [32])"Failed to set stencil operation",
                 (char (*) [17])"\nGL Error Code: ",&local_34);
      FormatString<char[6]>(&local_58,(char (*) [6])0x32952e);
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"SetStencilOp",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x239);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    (this->m_DSState).m_StencilOpState[bVar3].StencilFailOp = StencilFailOp;
    (this->m_DSState).m_StencilOpState[bVar3].StencilDepthFailOp = StencilDepthFailOp;
    (this->m_DSState).m_StencilOpState[bVar3].StencilPassOp = StencilPassOp;
  }
  return;
}

Assistant:

void GLContextState::SetStencilOp(GLenum Face, STENCIL_OP StencilFailOp, STENCIL_OP StencilDepthFailOp, STENCIL_OP StencilPassOp)
{
    DepthStencilGLState::StencilOpState& FaceStencilOp = m_DSState.m_StencilOpState[Face == GL_FRONT ? 0 : 1];
    if (FaceStencilOp.StencilFailOp != StencilFailOp ||
        FaceStencilOp.StencilDepthFailOp != StencilDepthFailOp ||
        FaceStencilOp.StencilPassOp != StencilPassOp)
    {
        GLenum glsfail = StencilOp2GlStencilOp(StencilFailOp);
        GLenum dpfail  = StencilOp2GlStencilOp(StencilDepthFailOp);
        GLenum dppass  = StencilOp2GlStencilOp(StencilPassOp);

        glStencilOpSeparate(Face, glsfail, dpfail, dppass);
        DEV_CHECK_GL_ERROR("Failed to set stencil operation");

        FaceStencilOp.StencilFailOp      = StencilFailOp;
        FaceStencilOp.StencilDepthFailOp = StencilDepthFailOp;
        FaceStencilOp.StencilPassOp      = StencilPassOp;
    }
}